

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O2

ParseArgumentStatus __thiscall
google::protobuf::compiler::CommandLineInterface::ParseArguments
          (CommandLineInterface *this,int argc,char **argv)

{
  pointer pbVar1;
  pointer pbVar2;
  bool bVar3;
  ParseArgumentStatus PVar4;
  ostream *poVar5;
  size_type sVar6;
  int iVar7;
  char *pcVar8;
  CommandLineInterface *this_00;
  ParseArgumentStatus unaff_R13D;
  string value;
  string name;
  
  this_00 = this;
  std::__cxx11::string::assign((char *)this);
  iVar7 = 1;
  do {
    if (argc <= iVar7) {
      if ((this->proto_path_).
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          (this->proto_path_).
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[1],_const_char_(&)[2],_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&name,(char (*) [1])0x22a40f,(char (*) [2])0x249067);
        std::
        vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
        ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                  ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                    *)&this->proto_path_,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&name);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&name);
      }
      pbVar1 = (this->input_files_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar2 = (this->input_files_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((this->mode_ == MODE_DECODE) && ((this->codec_type_)._M_string_length == 0)) {
        if (pbVar1 != pbVar2) {
          PVar4 = PARSE_ARGUMENT_FAIL;
          pcVar8 = "When using --decode_raw, no input files should be given.";
          goto LAB_001a33a5;
        }
      }
      else {
        PVar4 = PARSE_ARGUMENT_FAIL;
        if (pbVar1 == pbVar2) {
          pcVar8 = "Missing input file.";
          goto LAB_001a33a5;
        }
        if (((this->mode_ == MODE_COMPILE) &&
            ((this->output_directives_).
             super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             (this->output_directives_).
             super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
             ._M_impl.super__Vector_impl_data._M_finish)) &&
           ((this->descriptor_set_name_)._M_string_length == 0)) {
          pcVar8 = "Missing output directives.";
          goto LAB_001a33a5;
        }
      }
      sVar6 = (this->descriptor_set_name_)._M_string_length;
      if ((sVar6 == 0 & this->imports_in_descriptor_set_) == 1) {
        poVar5 = std::operator<<((ostream *)&std::cerr,
                                 "--include_imports only makes sense when combined with --descriptor_set_out."
                                );
        std::endl<char,std::char_traits<char>>(poVar5);
        sVar6 = (this->descriptor_set_name_)._M_string_length;
      }
      PVar4 = PARSE_ARGUMENT_DONE_AND_CONTINUE;
      if (this->source_info_in_descriptor_set_ != true) {
        return PARSE_ARGUMENT_DONE_AND_CONTINUE;
      }
      if (sVar6 != 0) {
        return PARSE_ARGUMENT_DONE_AND_CONTINUE;
      }
      pcVar8 = "--include_source_info only makes sense when combined with --descriptor_set_out.";
LAB_001a33a5:
      poVar5 = std::operator<<((ostream *)&std::cerr,pcVar8);
      std::endl<char,std::char_traits<char>>(poVar5);
      return PVar4;
    }
    name._M_dataplus._M_p = (pointer)&name.field_2;
    name._M_string_length = 0;
    value._M_dataplus._M_p = (pointer)&value.field_2;
    value._M_string_length = 0;
    name.field_2._M_local_buf[0] = '\0';
    value.field_2._M_local_buf[0] = '\0';
    bVar3 = ParseArgument(this_00,argv[iVar7],&name,&value);
    if (bVar3) {
      iVar7 = iVar7 + 1;
      if ((iVar7 != argc) && (*argv[iVar7] != '-')) {
        std::__cxx11::string::assign((char *)&value);
        goto LAB_001a325c;
      }
      poVar5 = std::operator<<((ostream *)&std::cerr,"Missing value for flag: ");
      poVar5 = std::operator<<(poVar5,(string *)&name);
      std::endl<char,std::char_traits<char>>(poVar5);
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &name,"--decode");
      if (bVar3) {
        poVar5 = std::operator<<((ostream *)&std::cerr,
                                 "To decode an unknown message, use --decode_raw.");
        std::endl<char,std::char_traits<char>>(poVar5);
      }
      bVar3 = false;
      unaff_R13D = PARSE_ARGUMENT_FAIL;
    }
    else {
LAB_001a325c:
      PVar4 = InterpretArgument(this,&name,&value);
      bVar3 = PVar4 == PARSE_ARGUMENT_DONE_AND_CONTINUE;
      if (!bVar3) {
        unaff_R13D = PVar4;
      }
      iVar7 = iVar7 + 1;
    }
    std::__cxx11::string::~string((string *)&value);
    this_00 = (CommandLineInterface *)&name;
    std::__cxx11::string::~string((string *)&name);
    if (!bVar3) {
      return unaff_R13D;
    }
  } while( true );
}

Assistant:

CommandLineInterface::ParseArgumentStatus
CommandLineInterface::ParseArguments(int argc, const char* const argv[]) {
  executable_name_ = argv[0];

  // Iterate through all arguments and parse them.
  for (int i = 1; i < argc; i++) {
    string name, value;

    if (ParseArgument(argv[i], &name, &value)) {
      // Returned true => Use the next argument as the flag value.
      if (i + 1 == argc || argv[i+1][0] == '-') {
        cerr << "Missing value for flag: " << name << endl;
        if (name == "--decode") {
          cerr << "To decode an unknown message, use --decode_raw." << endl;
        }
        return PARSE_ARGUMENT_FAIL;
      } else {
        ++i;
        value = argv[i];
      }
    }

    ParseArgumentStatus status = InterpretArgument(name, value);
    if (status != PARSE_ARGUMENT_DONE_AND_CONTINUE)
      return status;
  }

  // If no --proto_path was given, use the current working directory.
  if (proto_path_.empty()) {
    // Don't use make_pair as the old/default standard library on Solaris
    // doesn't support it without explicit template parameters, which are
    // incompatible with C++0x's make_pair.
    proto_path_.push_back(pair<string, string>("", "."));
  }

  // Check some errror cases.
  bool decoding_raw = (mode_ == MODE_DECODE) && codec_type_.empty();
  if (decoding_raw && !input_files_.empty()) {
    cerr << "When using --decode_raw, no input files should be given." << endl;
    return PARSE_ARGUMENT_FAIL;
  } else if (!decoding_raw && input_files_.empty()) {
    cerr << "Missing input file." << endl;
    return PARSE_ARGUMENT_FAIL;
  }
  if (mode_ == MODE_COMPILE && output_directives_.empty() &&
      descriptor_set_name_.empty()) {
    cerr << "Missing output directives." << endl;
    return PARSE_ARGUMENT_FAIL;
  }
  if (imports_in_descriptor_set_ && descriptor_set_name_.empty()) {
    cerr << "--include_imports only makes sense when combined with "
            "--descriptor_set_out." << endl;
  }
  if (source_info_in_descriptor_set_ && descriptor_set_name_.empty()) {
    cerr << "--include_source_info only makes sense when combined with "
            "--descriptor_set_out." << endl;
  }

  return PARSE_ARGUMENT_DONE_AND_CONTINUE;
}